

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIListener.cpp
# Opt level: O2

int initialize_tcp(string *host,string *port)

{
  FILE *__stream;
  int iVar1;
  int val;
  char *pcVar2;
  Error *this;
  addrinfo *addr_result;
  addrinfo addr_hints;
  addrinfo *local_50;
  addrinfo local_48;
  
  local_48.ai_flags = 0;
  local_48.ai_addrlen = 0;
  local_48._20_4_ = 0;
  local_48.ai_addr = (sockaddr *)0x0;
  local_48.ai_canonname = (char *)0x0;
  local_48.ai_next = (addrinfo *)0x0;
  local_48.ai_family = 2;
  local_48.ai_socktype = 1;
  local_48.ai_protocol = 6;
  iVar1 = getaddrinfo((host->_M_dataplus)._M_p,(port->_M_dataplus)._M_p,&local_48,&local_50);
  __stream = _stderr;
  if (iVar1 == 0) {
    iVar1 = socket(local_50->ai_family,local_50->ai_socktype,local_50->ai_protocol);
    no_err(iVar1,"tcp socket");
    val = connect(iVar1,local_50->ai_addr,local_50->ai_addrlen);
    no_err(val,"tcp connect");
    freeaddrinfo(local_50);
    return iVar1;
  }
  pcVar2 = gai_strerror(iVar1);
  fprintf(__stream,"getaddrinfo: %s",pcVar2);
  this = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this,"Failed to create tcp client socket");
  __cxa_throw(this,&Error::typeinfo,std::exception::~exception);
}

Assistant:

int initialize_tcp(std::string host, std::string port) {
  struct addrinfo addr_hints;
  struct addrinfo *addr_result;
  memset(&addr_hints, 0, sizeof(struct addrinfo));
  addr_hints.ai_family = AF_INET; // IPv4
  addr_hints.ai_socktype = SOCK_STREAM;
  addr_hints.ai_protocol = IPPROTO_TCP;
  int err = getaddrinfo(&host[0], &port[0], &addr_hints, &addr_result);
  if (err == EAI_SYSTEM || err != 0) {
    fprintf(stderr, "getaddrinfo: %s", gai_strerror(err));
    throw Error("Failed to create tcp client socket");
  }
  int sock;
  no_err(sock = socket(addr_result->ai_family, addr_result->ai_socktype, addr_result->ai_protocol), "tcp socket");
  no_err(connect(sock, addr_result->ai_addr, addr_result->ai_addrlen), "tcp connect");

  freeaddrinfo(addr_result);
  return sock;
}